

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O2

void hashword2(uint32_t *k,size_t length,uint32_t *pc,uint32_t *pb)

{
  uint uVar1;
  uint32_t *puVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  uVar5 = *pc + (int)length * 4 + 0xdeadbeef;
  puVar2 = k + 2;
  uVar1 = uVar5;
  uVar3 = uVar5;
  do {
    switch(length) {
    case 3:
      uVar3 = uVar3 + *puVar2;
    case 2:
      uVar1 = uVar1 + puVar2[-1];
    case 1:
      uVar3 = (uVar3 ^ uVar1) - (uVar1 << 0xe | uVar1 >> 0x12);
      uVar5 = (uVar5 + puVar2[-2] ^ uVar3) - (uVar3 * 0x800 | uVar3 >> 0x15);
      uVar1 = (uVar1 ^ uVar5) - (uVar5 * 0x2000000 | uVar5 >> 7);
      uVar3 = (uVar3 ^ uVar1) - (uVar1 * 0x10000 | uVar1 >> 0x10);
      uVar5 = (uVar5 ^ uVar3) - (uVar3 * 0x10 | uVar3 >> 0x1c);
      uVar1 = (uVar1 ^ uVar5) - (uVar5 * 0x4000 | uVar5 >> 0x12);
      uVar3 = (uVar3 ^ uVar1) - (uVar1 * 0x1000000 | uVar1 >> 8);
    case 0:
      *pc = uVar3;
      *pb = uVar1;
      return;
    default:
      uVar3 = uVar3 + *puVar2;
      uVar5 = (uVar3 * 0x10 | uVar3 >> 0x1c) ^ (uVar5 + puVar2[-2]) - uVar3;
      iVar4 = uVar3 + uVar1 + puVar2[-1];
      uVar3 = (uVar5 << 6 | uVar5 >> 0x1a) ^ (uVar1 + puVar2[-1]) - uVar5;
      iVar6 = uVar5 + iVar4;
      uVar1 = (uVar3 << 8 | uVar3 >> 0x18) ^ iVar4 - uVar3;
      iVar7 = uVar3 + iVar6;
      uVar5 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar6 - uVar1;
      iVar4 = uVar1 + iVar7;
      uVar1 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar7 - uVar5;
      uVar5 = uVar5 + iVar4;
      uVar3 = (uVar1 << 4 | uVar1 >> 0x1c) ^ iVar4 - uVar1;
      uVar1 = uVar1 + uVar5;
      length = length - 3;
      puVar2 = puVar2 + 3;
    }
  } while( true );
}

Assistant:

void hashword2(
const uint32_t *k,                   /* the key, an array of uint32_t values */
size_t          length,               /* the length of the key, in uint32_ts */
uint32_t        *pc,
uint32_t        *pb)         /* the previous hash, or an arbitrary value */
{
  uint32_t a,b,c;

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + (((uint32_t)length)<<2) + *pc;

  /*------------------------------------------------- handle most of the key */
  while (length > 3)
  {
    a += k[0];
    b += k[1];
    c += k[2];
    mix(a,b,c);
    length -= 3;
    k += 3;
  }

  /*------------------------------------------- handle the last 3 uint32_t's */
  switch(length)                     /* all the case statements fall through */
  { 
  case 3 : c+=k[2];
  case 2 : b+=k[1];
  case 1 : a+=k[0];
    final(a,b,c);
  case 0:     /* case 0: nothing left to add */
    break;
  }
  /*------------------------------------------------------ report the result */
  *pc = c;
  *pb = b;
}